

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519.c
# Opt level: O1

void ed25519_sign(uchar *m,size_t mlen,uchar *sk,uchar *pk,uchar *RS)

{
  bignum256modm_element_t *s;
  hash_512bits extsk;
  bignum256modm a;
  bignum256modm S;
  bignum256modm r;
  hash_512bits hram;
  hash_512bits hashr;
  ge25519 R;
  ed25519_hash_context ctx;
  byte local_2f8 [31];
  byte local_2d9;
  undefined1 local_2d8 [32];
  bignum256modm_element_t local_2b8 [6];
  bignum256modm_element_t local_288 [6];
  uint8_t local_258 [48];
  uchar local_228 [64];
  uchar local_1e8 [64];
  ge25519 local_1a8;
  SHA512_CTX local_108;
  
  SHA512(sk,0x20,local_2f8);
  local_2f8[0] = local_2f8[0] & 0xf8;
  local_2d9 = local_2d9 & 0x3f | 0x40;
  SHA512_Init(&local_108);
  SHA512_Update(&local_108,local_2d8,0x20);
  SHA512_Update(&local_108,m,mlen);
  SHA512_Final(local_1e8,&local_108);
  expand256_modm((bignum256modm_element_t *)local_258,local_1e8,0x40);
  ge25519_scalarmult_base_niels(&local_1a8,(uint8_t (*) [96])local_258,s);
  ge25519_pack(RS,&local_1a8);
  ed25519_hram(local_228,RS,pk,m,mlen);
  expand256_modm(local_288,local_228,0x40);
  expand256_modm(local_2b8,local_2f8,0x20);
  mul256_modm(local_288,local_288,local_2b8);
  add256_modm(local_288,local_288,(bignum256modm_element_t *)local_258);
  RS[0x20] = (uchar)local_288[0];
  RS[0x21] = (uchar)(local_288[0] >> 8);
  RS[0x22] = (uchar)(local_288[0] >> 0x10);
  RS[0x23] = (uchar)(local_288[0] >> 0x18);
  RS[0x24] = (uchar)(local_288[0] >> 0x20);
  RS[0x25] = (uchar)(local_288[0] >> 0x28);
  RS[0x26] = (uchar)(local_288[0] >> 0x30);
  RS[0x27] = (byte)local_288[1] | (byte)(local_288[0] >> 0x38);
  RS[0x28] = (uchar)(local_288[1] >> 8);
  RS[0x29] = (uchar)(local_288[1] >> 0x10);
  RS[0x2a] = (uchar)(local_288[1] >> 0x18);
  RS[0x2b] = (uchar)(local_288[1] >> 0x20);
  RS[0x2c] = (uchar)(local_288[1] >> 0x28);
  RS[0x2d] = (uchar)(local_288[1] >> 0x30);
  RS[0x2e] = (byte)local_288[2] | (byte)(local_288[1] >> 0x38);
  RS[0x2f] = (uchar)(local_288[2] >> 8);
  RS[0x30] = (uchar)(local_288[2] >> 0x10);
  RS[0x31] = (uchar)(local_288[2] >> 0x18);
  RS[0x32] = (uchar)(local_288[2] >> 0x20);
  RS[0x33] = (uchar)(local_288[2] >> 0x28);
  RS[0x34] = (uchar)(local_288[2] >> 0x30);
  RS[0x35] = (byte)local_288[3] | (byte)(local_288[2] >> 0x38);
  RS[0x36] = (uchar)(local_288[3] >> 8);
  RS[0x37] = (uchar)(local_288[3] >> 0x10);
  RS[0x38] = (uchar)(local_288[3] >> 0x18);
  RS[0x39] = (uchar)(local_288[3] >> 0x20);
  RS[0x3a] = (uchar)(local_288[3] >> 0x28);
  RS[0x3b] = (uchar)(local_288[3] >> 0x30);
  RS[0x3c] = (byte)(undefined4)local_288[4] | (byte)(local_288[3] >> 0x38);
  RS[0x3d] = (uchar)((uint)(undefined4)local_288[4] >> 8);
  RS[0x3e] = (uchar)((uint)(undefined4)local_288[4] >> 0x10);
  RS[0x3f] = (uchar)((uint)(undefined4)local_288[4] >> 0x18);
  return;
}

Assistant:

ge25519 ALIGN(16) R;
	hash_512bits extsk, hashr, hram;

	ed25519_extsk(extsk, sk);

	/* r = H(aExt[32..64], m) */
	ed25519_hash_init(&ctx);
	ed25519_hash_update(&ctx, extsk + 32, 32);
	ed25519_hash_update(&ctx, m, mlen);
	ed25519_hash_final(&ctx, hashr);
	expand256_modm(r, hashr, 64);

	/* R = rB */
	ge25519_scalarmult_base_niels(&R, ge25519_niels_base_multiples, r);
	ge25519_pack(RS, &R);

	/* S = H(R,A,m).. */
	ed25519_hram(hram, RS, pk, m, mlen);
	expand256_modm(S, hram, 64);

	/* S = H(R,A,m)a */
	expand256_modm(a, extsk, 32);
	mul256_modm(S, S, a);

	/* S = (r + H(R,A,m)a) */
	add256_modm(S, S, r);

	/* S = (r + H(R,A,m)a) mod L */	
	contract256_modm(RS + 32, S);
}

int
ED25519_FN(ed25519_sign_open) (const unsigned char *m, size_t mlen, const ed25519_public_key pk, const ed25519_signature RS) {
	ge25519 ALIGN(16) R, A;
	hash_512bits hash;
	bignum256modm hram, S;
	unsigned char checkR[32];

	if ((RS[63] & 224) || !ge25519_unpack_negative_vartime(&A, pk))
		return -1;

	/* hram = H(R,A,m) */
	ed25519_hram(hash, RS, pk, m, mlen);
	expand256_modm(hram, hash, 64);

	/* S */
	expand256_modm(S, RS + 32, 32);

	/* SB - H(R,A,m)A */
	ge25519_double_scalarmult_vartime(&R, &A, hram, S);
	ge25519_pack(checkR, &R);

	/* check that R = SB - H(R,A,m)A */
	return ed25519_verify(RS, checkR, 32) ? 0 : -1;
}